

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_gravity.c
# Opt level: O0

void fsnav_ins_gravity_constant(void)

{
  char *__nptr;
  double dVar1;
  double dVar2;
  ulong local_38;
  size_t i;
  double n1_n;
  char *cfg_ptr;
  double t0_default;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char t0_token [10];
  
  t0_default._6_1_ = 'a';
  t0_default._7_1_ = 'l';
  cStack_10 = 'i';
  cStack_f = 'g';
  cStack_e = 'n';
  cStack_d = 'm';
  cStack_c = 'e';
  cStack_b = 'n';
  t0_token[0] = 't';
  t0_token[1] = '\0';
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_gravity_constant::n = 0;
      fsnav_ins_gravity_constant::t0 = -1.0;
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        fsnav_ins_gravity_constant::f[local_38] = 0.0;
      }
      __nptr = fsnav_locate_token((char *)((long)&t0_default + 6),fsnav->imu->cfg,
                                  fsnav->imu->cfglength,'=');
      if ((__nptr == (char *)0x0) ||
         (fsnav_ins_gravity_constant::t0 = atof(__nptr), fsnav_ins_gravity_constant::t0 <= 0.0)) {
        fsnav_ins_gravity_constant::t0 = 60.0;
      }
    }
    else if (-1 < fsnav->mode) {
      fsnav->imu->g_valid = '\0';
      if ((fsnav->imu->t <= fsnav_ins_gravity_constant::t0) && (fsnav->imu->f_valid != '\0')) {
        fsnav_ins_gravity_constant::n = fsnav_ins_gravity_constant::n + 1;
        dVar1 = (double)fsnav_ins_gravity_constant::n;
        dVar2 = (double)fsnav_ins_gravity_constant::n;
        for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
          fsnav_ins_gravity_constant::f[local_38] =
               fsnav_ins_gravity_constant::f[local_38] * ((dVar1 - 1.0) / dVar2) +
               fsnav->imu->f[local_38] / (double)fsnav_ins_gravity_constant::n;
        }
        dVar1 = fsnav_linal_vnorm(fsnav_ins_gravity_constant::f,3);
        fsnav_ins_gravity_constant::g3 = -dVar1;
      }
      fsnav->imu->g[0] = 0.0;
      fsnav->imu->g[1] = 0.0;
      fsnav->imu->g[2] = fsnav_ins_gravity_constant::g3;
      fsnav->imu->g_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_gravity_constant(void) {

	const char   t0_token[] = "alignment"; // alignment duration parameter name in configuration
	const double t0_default = 60;          // default alignment duration

	static double
		f[3] = {0,0,0}, // average specific force vector measured by accelerometers
		g3   =  0,      // its norm
		t0   = -1;      // imu initial alignment duration
	static long n = 0;  // number of measurements used so far

	char   *cfg_ptr;    // pointer to a substring in configuration
	double  n1_n;       // (n - 1)/n
	size_t  i;          // index


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// initial values
		n  =  0;
		t0 = -1;
		// zero average specific force
		for (i = 0; i < 3; i++)
			f[i] = 0;
		// parse alignment duration from configuration string
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);		
		// if not found or invalid, set to default
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;

	}
	else if (fsnav->mode < 0) {	// terminate
		// do nothing
	}

	else						// main cycle
	{
		// validity flag down
		fsnav->imu->g_valid = 0;

		if (fsnav->imu->t <= t0 && fsnav->imu->f_valid) { // while alignment goes on, and accelerometer measurements are available
			n++;
			n1_n = (n - 1.0)/n;
			for (i = 0; i < 3; i++)
				f[i] = f[i]*n1_n + fsnav->imu->f[i]/n; // averaging components
			g3 = -fsnav_linal_vnorm(f,3);                   // renew magnitude, negative
		}
		// zero Eastern and Northern components
		fsnav->imu->g[0] = 0;
		fsnav->imu->g[1] = 0;
		// vertical component, negative magnitude of average measured specific force vector
		fsnav->imu->g[2] = g3;
		// validity flag up
		fsnav->imu->g_valid = 1;
	}

}